

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<SuperClass>::copyAppend
          (QGenericArrayOps<SuperClass> *this,SuperClass *b,SuperClass *e)

{
  SuperClass *pSVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<SuperClass>).ptr;
    lVar3 = (this->super_QArrayDataPointer<SuperClass>).size;
    do {
      pDVar2 = (b->classname).d.d;
      pSVar1[lVar3].classname.d.d = pDVar2;
      pSVar1[lVar3].classname.d.ptr = (b->classname).d.ptr;
      pSVar1[lVar3].classname.d.size = (b->classname).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->qualified).d.d;
      pSVar1[lVar3].qualified.d.d = pDVar2;
      pSVar1[lVar3].qualified.d.ptr = (b->qualified).d.ptr;
      pSVar1[lVar3].qualified.d.size = (b->qualified).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar1[lVar3].access = b->access;
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<SuperClass>).size + 1;
      (this->super_QArrayDataPointer<SuperClass>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }